

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

int m2v_LU_decomp_inplace(m2v *A,int *rp,int *cp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long in_RDX;
  m2v *in_RSI;
  int *in_RDI;
  int Lji;
  int j;
  int Uii_inv;
  int SwapInt__swval_1;
  int SwapInt__swval;
  int pcol;
  int prow;
  int i;
  uint in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int iVar4;
  int iVar5;
  
  for (iVar4 = 0; iVar4 < *in_RDI; iVar4 = iVar4 + 1) {
    (&in_RSI->n_row)[iVar4] = iVar4;
  }
  for (iVar4 = 0; iVar4 < in_RDI[1]; iVar4 = iVar4 + 1) {
    *(int *)(in_RDX + (long)iVar4 * 4) = iVar4;
  }
  iVar4 = 0;
  do {
    uVar1 = in_stack_ffffffffffffffc4 & 0xffffff;
    if (iVar4 < in_RDI[1]) {
      uVar1 = CONCAT13(iVar4 < *in_RDI,(int3)in_stack_ffffffffffffffc4);
    }
    in_stack_ffffffffffffffc4 = uVar1;
    iVar3 = iVar4;
    if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') {
      return iVar4;
    }
LAB_0010366d:
    iVar5 = iVar3;
    if (in_RDI[1] <= iVar4) {
      return iVar3;
    }
    while( true ) {
      if (*in_RDI <= iVar3) goto LAB_001036ba;
      iVar2 = m2v_get_el((m2v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      if (iVar2 != 0) break;
      iVar3 = iVar3 + 1;
    }
    if (iVar3 != iVar5) {
      in_stack_ffffffffffffffd8 = (&in_RSI->n_row)[iVar3];
      (&in_RSI->n_row)[iVar3] = (&in_RSI->n_row)[iVar5];
      (&in_RSI->n_row)[iVar5] = in_stack_ffffffffffffffd8;
      m2v_swap_rows((m2v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
    if (iVar4 != iVar5) {
      in_stack_ffffffffffffffd4 = *(int *)(in_RDX + (long)iVar4 * 4);
      *(undefined4 *)(in_RDX + (long)iVar4 * 4) = *(undefined4 *)(in_RDX + (long)iVar5 * 4);
      *(int *)(in_RDX + (long)iVar5 * 4) = in_stack_ffffffffffffffd4;
      m2v_swap_cols(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    }
    in_stack_ffffffffffffffd0 = 1;
    m2v_mult_col_from((m2v *)CONCAT44(iVar5,iVar3),iVar4,in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd4);
    in_stack_ffffffffffffffcc = iVar5;
    while (in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1,
          in_stack_ffffffffffffffcc < *in_RDI) {
      in_stack_ffffffffffffffc8 =
           m2v_get_el((m2v *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      m2v_multadd_row_from
                ((m2v *)CONCAT44(iVar5,iVar3),iVar4,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd4,
                 (m2v *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc4);
    }
    iVar4 = iVar5 + 1;
  } while( true );
LAB_001036ba:
  iVar4 = iVar4 + 1;
  iVar3 = iVar5;
  goto LAB_0010366d;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}